

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O3

void test_skiplist_insert_multiple(planck_unit_test_t *tc)

{
  int iVar1;
  sl_node *psVar2;
  bool bVar3;
  planck_unit_result_t pVar4;
  ion_status_t iVar5;
  int iVar6;
  ion_skiplist_t skiplist;
  ion_byte_t strs [5] [6];
  int local_94;
  ion_skiplist_t local_90;
  undefined8 uStack_58;
  undefined6 uStack_50;
  undefined2 local_4a;
  undefined6 uStack_48;
  undefined8 uStack_42;
  
  sl_initialize(&local_90,key_type_numeric_signed,4,10,7,1,4);
  local_90.super.compare = dictionary_compare_signed_value;
  uStack_48 = 0x72756f660065;
  uStack_42 = 0x657669660000;
  uStack_58 = 0x7774000000656e6f;
  uStack_50 = 0x68740000006f;
  local_4a = 0x6572;
  local_94 = 1;
  iVar6 = 0;
  do {
    iVar5 = sl_insert(&local_90,&local_94,(ion_value_t)((long)&uStack_58 + (long)iVar6 * 6));
    pVar4 = planck_unit_assert_true
                      (tc,(uint)(iVar5.error == '\0'),0xe5,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar4 == '\0') goto LAB_001019e6;
    pVar4 = planck_unit_assert_true
                      (tc,(uint)(iVar5.count == 1),0xe6,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar4 == '\0') goto LAB_001019e6;
    iVar1 = local_94 + 1;
    bVar3 = local_94 < 5;
    iVar6 = local_94;
    local_94 = iVar1;
  } while (bVar3);
  psVar2 = *(local_90.head)->next;
  pVar4 = planck_unit_assert_true
                    (tc,(uint)(*psVar2->key == 1),0xf0,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar4 != '\0') {
    pVar4 = planck_unit_assert_str_are_equal
                      (tc,(char *)psVar2->value,"one",0xf1,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                      );
    if (pVar4 != '\0') {
      psVar2 = *(*(local_90.head)->next)->next;
      pVar4 = planck_unit_assert_true
                        (tc,(uint)(*psVar2->key == 2),0xf4,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                         ,"condition was false, expected true");
      if (pVar4 != '\0') {
        pVar4 = planck_unit_assert_str_are_equal
                          (tc,(char *)psVar2->value,"two",0xf5,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                          );
        if (pVar4 != '\0') {
          psVar2 = *(*(*(local_90.head)->next)->next)->next;
          pVar4 = planck_unit_assert_true
                            (tc,(uint)(*psVar2->key == 3),0xf8,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                             ,"condition was false, expected true");
          if (pVar4 != '\0') {
            pVar4 = planck_unit_assert_str_are_equal
                              (tc,(char *)psVar2->value,"three",0xf9,
                               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                              );
            if (pVar4 != '\0') {
              psVar2 = *(*(*(*(local_90.head)->next)->next)->next)->next;
              pVar4 = planck_unit_assert_true
                                (tc,(uint)(*psVar2->key == 4),0xfc,
                                 "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                                 ,"condition was false, expected true");
              if (pVar4 != '\0') {
                pVar4 = planck_unit_assert_str_are_equal
                                  (tc,(char *)psVar2->value,"four",0xfd,
                                   "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                                  );
                if (pVar4 != '\0') {
                  psVar2 = *(*(*(*(*(local_90.head)->next)->next)->next)->next)->next;
                  pVar4 = planck_unit_assert_true
                                    (tc,(uint)(*psVar2->key == 5),0x100,
                                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                                     ,"condition was false, expected true");
                  if (pVar4 != '\0') {
                    pVar4 = planck_unit_assert_str_are_equal
                                      (tc,(char *)psVar2->value,"five",0x101,
                                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                                      );
                    if (pVar4 != '\0') {
                      sl_destroy(&local_90);
                      return;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_001019e6:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_skiplist_insert_multiple(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	ion_byte_t strs[5][6] = {
		"one", "two", "three", "four", "five"
	};

	int i;

	for (i = 1; i <= 5; i++) {
		ion_status_t status = sl_insert(&skiplist, (ion_key_t) &i, strs[i - 1]);

		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

#if ION_DEBUG
	print_skiplist(&skip_list);
#endif

	ion_sl_node_t *cursor;

	cursor = skiplist.head->next[0];
	PLANCK_UNIT_ASSERT_TRUE(tc, *((int *) cursor->key) == 1);
	PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) cursor->value, "one");

	cursor = skiplist.head->next[0]->next[0];
	PLANCK_UNIT_ASSERT_TRUE(tc, *((int *) cursor->key) == 2);
	PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) cursor->value, "two");

	cursor = skiplist.head->next[0]->next[0]->next[0];
	PLANCK_UNIT_ASSERT_TRUE(tc, *((int *) cursor->key) == 3);
	PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) cursor->value, "three");

	cursor = skiplist.head->next[0]->next[0]->next[0]->next[0];
	PLANCK_UNIT_ASSERT_TRUE(tc, *((int *) cursor->key) == 4);
	PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) cursor->value, "four");

	cursor = skiplist.head->next[0]->next[0]->next[0]->next[0]->next[0];
	PLANCK_UNIT_ASSERT_TRUE(tc, *((int *) cursor->key) == 5);
	PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) cursor->value, "five");

	sl_destroy(&skiplist);
}